

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void cppcms::impl::md5_append(md5_state_t *pms,md5_byte_t *data,int nbytes)

{
  int iVar1;
  md5_word_t mVar2;
  uint uVar3;
  ulong __n;
  uint uVar4;
  ulong uVar5;
  
  if (0 < nbytes) {
    uVar5 = (ulong)(uint)nbytes;
    uVar3 = pms->count[0];
    uVar4 = uVar3 >> 3 & 0x3f;
    mVar2 = ((uint)nbytes >> 0x1d) + pms->count[1];
    pms->count[1] = mVar2;
    pms->count[0] = nbytes * 8 + uVar3;
    if (CARRY4(nbytes * 8,uVar3)) {
      pms->count[1] = mVar2 + 1;
    }
    if (uVar4 != 0) {
      __n = (ulong)(0x40 - uVar4);
      if ((int)(nbytes + uVar4) < 0x41) {
        __n = uVar5;
      }
      memcpy(pms->buf + uVar4,data,__n);
      if ((int)((int)__n + uVar4) < 0x40) {
        return;
      }
      data = data + __n;
      uVar5 = (ulong)(uint)(nbytes - (int)__n);
      md5_process(pms,pms->buf);
    }
    uVar3 = (uint)uVar5;
    if (0x3f < (int)uVar3) {
      do {
        md5_process(pms,data);
        data = data + 0x40;
        iVar1 = (int)uVar5;
        uVar3 = iVar1 - 0x40;
        uVar5 = (ulong)uVar3;
      } while (0x7f < iVar1);
    }
    if (uVar3 != 0) {
      memcpy(pms->buf,data,(long)(int)uVar3);
      return;
    }
  }
  return;
}

Assistant:

void
md5_append(md5_state_t *pms, const md5_byte_t *data, int nbytes)
{
    const md5_byte_t *p = data;
    int left = nbytes;
    int offset = (pms->count[0] >> 3) & 63;
    md5_word_t nbits = (md5_word_t)(nbytes << 3);

    if (nbytes <= 0)
	return;

    /* Update the message length. */
    pms->count[1] += nbytes >> 29;
    pms->count[0] += nbits;
    if (pms->count[0] < nbits)
	pms->count[1]++;

    /* Process an initial partial block. */
    if (offset) {
	int copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

	memcpy(pms->buf + offset, p, copy);
	if (offset + copy < 64)
	    return;
	p += copy;
	left -= copy;
	md5_process(pms, pms->buf);
    }

    /* Process full blocks. */
    for (; left >= 64; p += 64, left -= 64)
	md5_process(pms, p);

    /* Process a final partial block. */
    if (left)
	memcpy(pms->buf, p, left);
}